

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool __thiscall Fossilize::ExternalReplayer::Impl::send_message(Impl *this,char *msg)

{
  int __fd;
  size_t __n;
  ssize_t sVar1;
  ssize_t ret;
  char *msg_local;
  Impl *this_local;
  
  if (this->control_fd < 0) {
    this_local._7_1_ = false;
  }
  else {
    __fd = this->control_fd;
    __n = strlen(msg);
    sVar1 = send(__fd,msg,__n,0x4000);
    this_local._7_1_ = -1 < sVar1;
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalReplayer::Impl::send_message(const char *msg)
{
	if (control_fd < 0)
		return false;
#ifdef __linux__
	auto ret = send(control_fd, msg, strlen(msg), MSG_NOSIGNAL);
#else
	// Apparently MSG_NOSIGNAL is POSIX, but does not exist on macOS?
	auto ret = send(control_fd, msg, strlen(msg), 0);
#endif
	return ret >= 0;
}